

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int re2::Fanout(Prog *prog,vector<int,_std::allocator<int>_> *histogram)

{
  iterator pIVar1;
  int iVar2;
  iterator pIVar3;
  int *piVar4;
  uint32_t *puVar5;
  int local_f4;
  int local_f0;
  uint local_ec;
  int bucket;
  uint32_t value;
  iterator i;
  int iStack_d8;
  int size;
  int data [32];
  undefined1 local_40 [8];
  SparseArray<int> fanout;
  vector<int,_std::allocator<int>_> *histogram_local;
  Prog *prog_local;
  
  fanout.dense_.ptr_._M_t.
  super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
  .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl =
       (IndexValue *)histogram;
  iVar2 = Prog::size(prog);
  SparseArray<int>::SparseArray((SparseArray<int> *)local_40,iVar2);
  Prog::Fanout(prog,(SparseArray<int> *)local_40);
  data[0x1a] = 0;
  data[0x1b] = 0;
  data[0x1c] = 0;
  data[0x1d] = 0;
  data[0x16] = 0;
  data[0x17] = 0;
  data[0x18] = 0;
  data[0x19] = 0;
  data[0x12] = 0;
  data[0x13] = 0;
  data[0x14] = 0;
  data[0x15] = 0;
  data[0xe] = 0;
  data[0xf] = 0;
  data[0x10] = 0;
  data[0x11] = 0;
  data[10] = 0;
  data[0xb] = 0;
  data[0xc] = 0;
  data[0xd] = 0;
  data[6] = 0;
  data[7] = 0;
  data[8] = 0;
  data[9] = 0;
  data[2] = 0;
  data[3] = 0;
  data[4] = 0;
  data[5] = 0;
  _iStack_d8 = 0;
  data[0] = 0;
  data[1] = 0;
  i._4_4_ = 0;
  for (_bucket = SparseArray<int>::begin((SparseArray<int> *)local_40); pIVar1 = _bucket,
      pIVar3 = SparseArray<int>::end((SparseArray<int> *)local_40), pIVar1 != pIVar3;
      _bucket = _bucket + 1) {
    piVar4 = SparseArray<int>::IndexValue::value(_bucket);
    if (*piVar4 != 0) {
      puVar5 = (uint32_t *)SparseArray<int>::IndexValue::value(_bucket);
      local_ec = *puVar5;
      iVar2 = FindMSBSet(local_ec);
      local_f0 = (iVar2 + 1) - (uint)((local_ec & local_ec - 1) == 0);
      data[(long)local_f0 + -2] = data[(long)local_f0 + -2] + 1;
      local_f4 = local_f0 + 1;
      piVar4 = CLI::std::max<int>((int *)((long)&i + 4),&local_f4);
      i._4_4_ = *piVar4;
    }
  }
  if (fanout.dense_.ptr_._M_t.
      super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
      ._M_t.
      super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
      .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl !=
      (IndexValue *)0x0) {
    std::vector<int,std::allocator<int>>::assign<int*,void>
              ((vector<int,std::allocator<int>> *)
               fanout.dense_.ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl,
               &iStack_d8,data + (long)i._4_4_ + -2);
  }
  iVar2 = i._4_4_ + -1;
  SparseArray<int>::~SparseArray((SparseArray<int> *)local_40);
  return iVar2;
}

Assistant:

static int Fanout(Prog* prog, std::vector<int>* histogram) {
  SparseArray<int> fanout(prog->size());
  prog->Fanout(&fanout);
  int data[32] = {};
  int size = 0;
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    if (i->value() == 0)
      continue;
    uint32_t value = i->value();
    int bucket = FindMSBSet(value);
    bucket += value & (value-1) ? 1 : 0;
    ++data[bucket];
    size = std::max(size, bucket+1);
  }
  if (histogram != NULL)
    histogram->assign(data, data+size);
  return size-1;
}